

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target,EpsCopyOutputStream *stream)

{
  EpsCopyOutputStream *in_R8;
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  anon_class_16_2_d2ac9ea8 func;
  uint8 *local_20;
  
  pKVar1 = (this->map_).flat;
  local_20 = target;
  if (this->flat_capacity_ < 0x101) {
    if (this->flat_size_ != 0) {
      pKVar2 = pKVar1 + this->flat_size_;
      do {
        target = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                           (&pKVar1->second,pKVar1->first,target,stream);
        pKVar1 = pKVar1 + 1;
      } while (pKVar1 != pKVar2);
    }
  }
  else {
    func.stream = in_R8;
    func.target = &stream->end_;
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
              ((ExtensionSet *)(pKVar1->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar1->second,(_Base_ptr)&local_20,func);
    target = local_20;
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  ForEach([&target, stream](int number, const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        number, target, stream);
  });
  return target;
}